

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode_huffman_tree(huffman_conflict *hf,uint rbits,wchar_t c)

{
  ushort uVar1;
  wchar_t wVar2;
  wchar_t extlen;
  htree_t *ht;
  wchar_t c_local;
  uint rbits_local;
  huffman_conflict *hf_local;
  
  extlen = hf->shift_bits;
  c_local = c;
  while( true ) {
    if (c_local < hf->len_avail) {
      return c_local;
    }
    wVar2 = c_local - hf->len_avail;
    if ((extlen < L'\x01') || (hf->tree_used <= wVar2)) break;
    if ((rbits & 1 << ((byte)(extlen + L'\xffffffff') & 0x1f)) == 0) {
      uVar1 = hf->tree[wVar2].right;
    }
    else {
      uVar1 = hf->tree[wVar2].left;
    }
    c_local = (wchar_t)uVar1;
    extlen = extlen + L'\xffffffff';
  }
  return L'\0';
}

Assistant:

static int
lzh_decode_huffman_tree(struct huffman *hf, unsigned rbits, int c)
{
	struct htree_t *ht;
	int extlen;

	ht = hf->tree;
	extlen = hf->shift_bits;
	while (c >= hf->len_avail) {
		c -= hf->len_avail;
		if (extlen-- <= 0 || c >= hf->tree_used)
			return (0);
		if (rbits & (1U << extlen))
			c = ht[c].left;
		else
			c = ht[c].right;
	}
	return (c);
}